

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Distribution(int g_a,int iproc,int *lo,int *hi)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer local_a8 [8];
  Integer local_68 [8];
  
  IVar1 = pnga_ndim((long)g_a);
  pnga_distribution((long)g_a,(long)iproc,local_68,local_a8);
  lVar3 = 0;
  lVar2 = 0;
  if (0 < IVar1) {
    lVar2 = IVar1;
  }
  piVar4 = lo + IVar1;
  for (; piVar4 = piVar4 + -1, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *piVar4 = (int)local_68[lVar3] + -1;
  }
  piVar4 = hi + IVar1;
  for (lVar3 = 0; piVar4 = piVar4 + -1, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *piVar4 = (int)local_a8[lVar3] + -1;
  }
  return;
}

Assistant:

void NGA_Distribution(int g_a, int iproc, int lo[], int hi[])
{
     Integer a=(Integer)g_a;
     Integer p=(Integer)iproc;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     wnga_distribution(a, p, _ga_lo, _ga_hi);
     COPYINDEX_F2C(_ga_lo,lo, ndim);
     COPYINDEX_F2C(_ga_hi,hi, ndim);
}